

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O1

bool __thiscall BinarySearchTree::removeElement(BinarySearchTree *this,int value)

{
  int iVar1;
  Node *pNVar2;
  Node *child;
  Node **ppNVar3;
  Node *loc;
  Node *par;
  
  loc = this->root;
  if (loc != (Node *)0x0) {
    if (loc->value == value) {
      par = (Node *)0x0;
    }
    else {
      pNVar2 = (&loc->leftChild)[loc->value <= value];
      par = loc;
      if (pNVar2 == (Node *)0x0) {
LAB_00105ae4:
        loc = (Node *)0x0;
      }
      else {
        iVar1 = pNVar2->value;
        loc = pNVar2;
        while (iVar1 != value) {
          pNVar2 = (&loc->leftChild)[iVar1 <= value];
          par = loc;
          if (pNVar2 == (Node *)0x0) goto LAB_00105ae4;
          loc = pNVar2;
          iVar1 = pNVar2->value;
        }
      }
    }
    if (loc != (Node *)0x0) {
      if ((loc->leftChild == (Node *)0x0) && (loc->rightChild == (Node *)0x0)) {
        ppNVar3 = &this->root;
        if (par != (Node *)0x0) {
          ppNVar3 = &par->rightChild;
          if (par->leftChild == loc) {
            ppNVar3 = &par->leftChild;
          }
        }
        *ppNVar3 = (Node *)0x0;
      }
      if ((loc->leftChild != (Node *)0x0) && (loc->rightChild == (Node *)0x0)) {
        ppNVar3 = &this->root;
        if (par != (Node *)0x0) {
          ppNVar3 = &par->rightChild;
          if (par->leftChild == loc) {
            ppNVar3 = &par->leftChild;
          }
        }
        *ppNVar3 = loc->leftChild;
      }
      if ((loc->leftChild == (Node *)0x0) && (loc->rightChild != (Node *)0x0)) {
        ppNVar3 = &this->root;
        if (par != (Node *)0x0) {
          ppNVar3 = &par->rightChild;
          if (par->leftChild == loc) {
            ppNVar3 = &par->leftChild;
          }
        }
        *ppNVar3 = loc->rightChild;
      }
      if ((loc->leftChild != (Node *)0x0) && (loc->rightChild != (Node *)0x0)) {
        caseC(this,par,loc);
      }
      operator_delete(loc,0x18);
      return true;
    }
  }
  return false;
}

Assistant:

bool BinarySearchTree::removeElement(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}